

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManyToOneRingBuffer.h
# Opt level: O2

ssize_t __thiscall
aeron::concurrent::ringbuffer::ManyToOneRingBuffer::write
          (ManyToOneRingBuffer *this,int __fd,void *__buf,size_t __n)

{
  index_t offset;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  IllegalArgumentException *this_00;
  char *pcVar2;
  index_t in_R8D;
  allocator local_b6;
  allocator local_b5;
  int local_b4;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined8 uVar1;
  
  if (0 < __fd) {
    checkMsgLength(this,in_R8D);
    offset = claimCapacity(this,in_R8D + 0xfU & 0xfffffff8);
    uVar1 = CONCAT44(extraout_var,offset);
    if (offset != -2) {
      local_b4 = in_R8D + 8;
      AtomicBuffer::putInt64Ordered(this->m_buffer,offset,CONCAT44(__fd,-8 - in_R8D));
      AtomicBuffer::putBytes(this->m_buffer,offset + 8,(AtomicBuffer *)__buf,(index_t)__n,in_R8D);
      AtomicBuffer::putInt32Ordered(this->m_buffer,offset,local_b4);
      uVar1 = extraout_RAX;
    }
    return CONCAT71((int7)((ulong)uVar1 >> 8),offset != -2);
  }
  this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_70,__fd);
  std::operator+(&local_50,"Message type id must be greater than zero, msgTypeId=",&local_70);
  std::__cxx11::string::string
            ((string *)&local_90,
             "void aeron::concurrent::ringbuffer::RecordDescriptor::checkMsgTypeId(std::int32_t)",
             &local_b5);
  pcVar2 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/ringbuffer/RecordDescriptor.h"
                            );
  std::__cxx11::string::string((string *)&local_b0,pcVar2,&local_b6);
  util::IllegalArgumentException::IllegalArgumentException
            (this_00,&local_50,&local_90,&local_b0,0x56);
  __cxa_throw(this_00,&util::IllegalArgumentException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

bool write(
        std::int32_t msgTypeId, concurrent::AtomicBuffer& srcBuffer, util::index_t srcIndex, util::index_t length)
    {
        bool isSuccessful = false;

        RecordDescriptor::checkMsgTypeId(msgTypeId);
        checkMsgLength(length);

        const util::index_t recordLength = length + RecordDescriptor::HEADER_LENGTH;
        const util::index_t requiredCapacity = util::BitUtil::align(recordLength, RecordDescriptor::ALIGNMENT);
        const util::index_t recordIndex = claimCapacity(requiredCapacity);

        if (INSUFFICIENT_CAPACITY != recordIndex)
        {
            m_buffer.putInt64Ordered(recordIndex, RecordDescriptor::makeHeader(-recordLength, msgTypeId));
            m_buffer.putBytes(RecordDescriptor::encodedMsgOffset(recordIndex), srcBuffer, srcIndex, length);
            m_buffer.putInt32Ordered(RecordDescriptor::lengthOffset(recordIndex), recordLength);

            isSuccessful = true;
        }

        return isSuccessful;
    }